

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binproc.c
# Opt level: O0

int nn_binproc_create(nn_ep *ep)

{
  nn_ctx *ctx;
  nn_ep *in_RDI;
  nn_binproc *self;
  int rc;
  nn_ins_fn in_stack_00000020;
  nn_ins_item *in_stack_00000028;
  nn_ep *in_stack_ffffffffffffffd8;
  nn_ctx *shutdown_fn;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  int local_4;
  
  ctx = (nn_ctx *)nn_alloc_(0x164be3);
  if (ctx == (nn_ctx *)0x0) {
    nn_backtrace_print();
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/inproc/binproc.c"
            ,0x40);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_ins_item_init((nn_ins_item *)ctx,in_stack_ffffffffffffffd8);
  shutdown_fn = ctx;
  nn_ep_getctx((nn_ep *)0x164c65);
  nn_fsm_init_root(&in_RDI->fsm,
                   (nn_fsm_fn)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                   (nn_fsm_fn)shutdown_fn,ctx);
  shutdown_fn[1].sync.mutex.__data.__lock = 1;
  nn_list_init((nn_list *)&shutdown_fn[1].pool);
  nn_fsm_start((nn_fsm *)0x164ca6);
  local_4 = nn_ins_bind(in_stack_00000028,in_stack_00000020);
  if (local_4 < 0) {
    nn_list_term((nn_list *)0x164cd7);
    (shutdown_fn->sync).mutex.__data.__kind = 1;
    nn_fsm_term((nn_fsm *)0x164ced);
    nn_ins_item_term((nn_ins_item *)0x164cfb);
    nn_free((void *)0x164d05);
  }
  else {
    nn_ep_tran_setup(in_RDI,&nn_binproc_ops,shutdown_fn);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int nn_binproc_create (struct nn_ep *ep)
{
    int rc;
    struct nn_binproc *self;

    self = nn_alloc (sizeof (struct nn_binproc), "binproc");
    alloc_assert (self);

    nn_ins_item_init (&self->item, ep);
    nn_fsm_init_root (&self->fsm, nn_binproc_handler, nn_binproc_shutdown,
        nn_ep_getctx (ep));
    self->state = NN_BINPROC_STATE_IDLE;
    nn_list_init (&self->sinprocs);

    /*  Start the state machine. */
    nn_fsm_start (&self->fsm);

    /*  Register the inproc endpoint into a global repository. */
    rc = nn_ins_bind (&self->item, nn_binproc_connect);
    if (rc < 0) {
        nn_list_term (&self->sinprocs);

        /*  TODO: Now, this is ugly! We are getting the state machine into
            the idle state manually. How should it be done correctly? */
        self->fsm.state = 1;
        nn_fsm_term (&self->fsm);

        nn_ins_item_term (&self->item);
        nn_free (self);
        return rc;
    }

    nn_ep_tran_setup (ep, &nn_binproc_ops, self);
    return 0;
}